

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apu.cpp
# Opt level: O2

void __thiscall
trackerboy::apu::Mixer::mixfast<(trackerboy::apu::MixMode)2>
          (Mixer *this,int8_t delta,uint32_t cycletime)

{
  long lVar1;
  undefined7 in_register_00000031;
  float fVar2;
  MixParam local_30;
  
  getMixParameters(&local_30,this,cycletime);
  fVar2 = (float)(int)CONCAT71(in_register_00000031,delta) * this->mVolumeStepLeft;
  local_30.timeFract = local_30.timeFract * fVar2;
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    local_30.dest[lVar1 * 2] =
         local_30.stepset[lVar1] * (fVar2 - local_30.timeFract) +
         local_30.stepset[lVar1 + 0x10] * local_30.timeFract + local_30.dest[lVar1 * 2];
  }
  return;
}

Assistant:

void Mixer::mixfast(int8_t delta, uint32_t cycletime) {
    // muted mixing is a no-op, so don't bother instantiating a template
    // for this mode.
    static_assert(mode != MixMode::mute, "cannot mix a muted mode!");

    auto param = getMixParameters(cycletime);

    if constexpr (mode == MixMode::right) {
        ++param.dest;
    }

    std::pair<float, float> deltaLeft, deltaRight;

    if constexpr (modePansLeft(mode)) {
        deltaLeft = deltaScale(delta, mVolumeStepLeft, param.timeFract);
    }

    if constexpr (modePansRight(mode)) {
        deltaRight = deltaScale(delta, mVolumeStepRight, param.timeFract);
    }

    // interpolate with the next step set
    auto nextset = param.stepset + TU::STEP_WIDTH;
    for (auto i = TU::STEP_WIDTH; i--; ) {
        auto const s0 = *param.stepset++;
        auto const s1 = *nextset++;


        if constexpr (modePansLeft(mode)) {
            *param.dest++ += deltaLeft.first * s0 + deltaLeft.second * s1;
        }

        if constexpr (modePansRight(mode)) {
            *param.dest++ += deltaRight.first * s0 + deltaRight.second * s1;
        }

        if constexpr (mode != MixMode::middle) {
            ++param.dest;
        }
    }

}